

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::RegisterMulticastListener
          (CommissionerSafe *this,Handler<uint8_t> *aHandler,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  anon_class_72_4_c16cb468 local_90;
  AsyncRequest local_48;
  uint32_t local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  uint32_t aTimeout_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aMulticastAddrList_local;
  Handler<uint8_t> *aHandler_local;
  CommissionerSafe *this_local;
  
  local_90.this = this;
  local_24 = aTimeout;
  pvStack_20 = aMulticastAddrList;
  aMulticastAddrList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)aHandler;
  aHandler_local = (Handler<uint8_t> *)this;
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            (&local_90.aHandler,aHandler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90.aMulticastAddrList,pvStack_20);
  local_90.aTimeout = local_24;
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::RegisterMulticastListener(std::function<void(unsigned_char_const*,ot::commissioner::Error)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)::__0,void>
            ((function<void()> *)&local_48,&local_90);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  RegisterMulticastListener(std::function<void(unsigned_char_const*,ot::commissioner::Error)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)
  ::$_0::~__0((__0 *)&local_90);
  return;
}

Assistant:

void CommissionerSafe::RegisterMulticastListener(Handler<uint8_t>                aHandler,
                                                 const std::vector<std::string> &aMulticastAddrList,
                                                 uint32_t                        aTimeout)
{
    PushAsyncRequest([=]() { mImpl->RegisterMulticastListener(aHandler, aMulticastAddrList, aTimeout); });
}